

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

void __thiscall
Apple::IIgs::Sound::GLU::GLU(GLU *this,AsyncTaskQueue<false,_true,_void> *audio_queue)

{
  MemoryWrite *pMVar1;
  int c;
  long lVar2;
  
  this->audio_queue_ = audio_queue;
  this->address_ = 0;
  this->pending_store_read_ = 0;
  this->pending_store_read_time_ = 0;
  this->pending_store_write_ = 0;
  this->pending_store_write_time_ = 0;
  lVar2 = -0x280;
  do {
    (this->remote_).ram_[lVar2 + 8] = '\0';
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0);
  (this->local_).control = '\0';
  (this->local_).oscillator_count = 1;
  lVar2 = -0x280;
  do {
    *(undefined1 *)((long)&((GLU *)(this[1].pending_stores_ + -2))->audio_queue_ + lVar2) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0);
  (this->remote_).control = '\0';
  (this->remote_).oscillator_count = 1;
  this->output_range_ = 0;
  lVar2 = 0;
  do {
    LOCK();
    pMVar1 = &this->pending_stores_[lVar2]._M_i;
    pMVar1->time = 0;
    pMVar1->address = 0;
    pMVar1->value = '\0';
    pMVar1->enabled = false;
    UNLOCK();
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4000);
  return;
}

Assistant:

GLU::GLU(Concurrency::AsyncTaskQueue<false> &audio_queue) : audio_queue_(audio_queue) {
	// Reset all pending stores.
	MemoryWrite disabled_write;
	disabled_write.enabled = false;
	for(int c = 0; c < StoreBufferSize; c++) {
		pending_stores_[c].store(disabled_write);
	}
}